

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnTryTableExpr
          (BinaryReaderLogging *this,Type sig_type,CatchClauseVector *catches)

{
  uint uVar1;
  bool bVar2;
  Enum EVar3;
  size_type sVar4;
  reference pCVar5;
  Index depth;
  Index tag;
  CatchClause *catch_;
  const_iterator __end1;
  const_iterator __begin1;
  CatchClauseVector *__range1;
  Index count;
  CatchClauseVector *catches_local;
  BinaryReaderLogging *this_local;
  Type sig_type_local;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnTryTableExpr(sig: ");
  LogType(this,sig_type);
  sVar4 = std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::size(catches);
  __range1._4_4_ = (int)sVar4;
  Stream::Writef(this->stream_,", n: %u, catches: [",sVar4 & 0xffffffff);
  __end1 = std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::begin(catches);
  catch_ = (CatchClause *)
           std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>::end(catches);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
                                     *)&catch_), bVar2) {
    pCVar5 = __gnu_cxx::
             __normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
             ::operator*(&__end1);
    uVar1 = pCVar5->depth;
    switch(pCVar5->kind) {
    case Catch:
      Stream::Writef(this->stream_,"catch %u %u",(ulong)pCVar5->tag,(ulong)uVar1);
      break;
    case CatchRef:
      Stream::Writef(this->stream_,"catch_ref %u %u",(ulong)pCVar5->tag,(ulong)uVar1);
      break;
    case CatchAll:
      Stream::Writef(this->stream_,"catch_all %u",(ulong)uVar1);
      break;
    case CatchAllRef:
      Stream::Writef(this->stream_,"catch_all_ref %u",(ulong)uVar1);
    }
    __range1._4_4_ = __range1._4_4_ + -1;
    if (__range1._4_4_ != 0) {
      Stream::Writef(this->stream_,", ");
    }
    __gnu_cxx::
    __normal_iterator<const_wabt::CatchClause_*,_std::vector<wabt::CatchClause,_std::allocator<wabt::CatchClause>_>_>
    ::operator++(&__end1);
  }
  Stream::Writef(this->stream_,"])\n");
  EVar3 = (*this->reader_->_vptr_BinaryReaderDelegate[0x85])(this->reader_,sig_type,catches);
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderLogging::OnTryTableExpr(Type sig_type,
                                           const CatchClauseVector& catches) {
  LOGF("OnTryTableExpr(sig: ");
  LogType(sig_type);
  Index count = catches.size();
  LOGF_NOINDENT(", n: %" PRIindex ", catches: [", count);

  for (auto& catch_ : catches) {
    auto tag = catch_.tag;
    auto depth = catch_.depth;
    switch (catch_.kind) {
      case CatchKind::Catch:
        LOGF_NOINDENT("catch %" PRIindex " %" PRIindex, tag, depth);
        break;
      case CatchKind::CatchRef:
        LOGF_NOINDENT("catch_ref %" PRIindex " %" PRIindex, tag, depth);
        break;
      case CatchKind::CatchAll:
        LOGF_NOINDENT("catch_all %" PRIindex, depth);
        break;
      case CatchKind::CatchAllRef:
        LOGF_NOINDENT("catch_all_ref %" PRIindex, depth);
        break;
    }
    if (--count != 0) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("])\n");

  return reader_->OnTryTableExpr(sig_type, catches);
}